

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void * argtable3_xrealloc(void *ptr,size_t size)

{
  void *pvVar1;
  size_t local_30;
  void *ret;
  size_t allocated_size;
  size_t size_local;
  void *ptr_local;
  
  local_30 = size;
  if (size == 0) {
    local_30 = 1;
  }
  pvVar1 = realloc(ptr,local_30);
  if (pvVar1 == (void *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  return pvVar1;
}

Assistant:

void* xrealloc(void* ptr, size_t size) {
    size_t allocated_size = size ? size : 1;
    void* ret = realloc(ptr, allocated_size);
    if (!ret) {
        s_panic("Out of memory!\n");
    }
    return ret;
}